

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int Curl_removeHandleFromPipeline(Curl_easy *handle,curl_llist *pipeline)

{
  curl_llist_element *e;
  curl_llist *pcVar1;
  
  pcVar1 = pipeline;
  if (pipeline != (curl_llist *)0x0) {
    while (e = pcVar1->head, e != (curl_llist_element *)0x0) {
      if ((Curl_easy *)e->ptr == handle) {
        Curl_llist_remove(pipeline,e,(void *)0x0);
        return 1;
      }
      pcVar1 = (curl_llist *)&e->next;
    }
  }
  return 0;
}

Assistant:

int Curl_removeHandleFromPipeline(struct Curl_easy *handle,
                                  struct curl_llist *pipeline)
{
  if(pipeline) {
    struct curl_llist_element *curr;

    curr = pipeline->head;
    while(curr) {
      if(curr->ptr == handle) {
        Curl_llist_remove(pipeline, curr, NULL);
        return 1; /* we removed a handle */
      }
      curr = curr->next;
    }
  }

  return 0;
}